

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void add_module_headers(path *dir,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *headers)

{
  recur_dir_itr_imp *prVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  recursive_directory_iterator it;
  recursive_directory_iterator last;
  recursive_directory_iterator local_30;
  intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> local_28 [2];
  
  boost::filesystem::detail::status((path *)&local_30,(error_code *)dir);
  if (1 < (uint)local_30.m_imp.px) {
    boost::filesystem::recursive_directory_iterator::recursive_directory_iterator(&local_30,dir);
    local_28[0].px = (recur_dir_itr_imp *)0x0;
    while( true ) {
      prVar1 = (recur_dir_itr_imp *)CONCAT44(local_30.m_imp.px._4_4_,(uint)local_30.m_imp.px);
      if ((prVar1 == local_28[0].px) ||
         (((prVar1 == (recur_dir_itr_imp *)0x0 ||
           (*(long *)(prVar1 + 8) == *(long *)(prVar1 + 0x10))) &&
          ((local_28[0].px == (recur_dir_itr_imp *)0x0 ||
           (*(long *)(local_28[0].px + 8) == *(long *)(local_28[0].px + 0x10))))))) break;
      boost::filesystem::recursive_directory_iterator::dereference(&local_30);
      boost::filesystem::directory_entry::get_status((error_code *)(local_28 + 1));
      if (local_28[1].px._0_4_ != 3) {
        __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              boost::filesystem::recursive_directory_iterator::dereference(&local_30);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)headers,__v);
      }
      boost::filesystem::detail::recursive_directory_iterator_increment(&local_30,(error_code *)0x0)
      ;
    }
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(local_28);
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr
              (&local_30.m_imp);
  }
  return;
}

Assistant:

static void add_module_headers( fs::path const & dir, std::set<std::string> & headers )
{
    if( fs::exists( dir ) )
    {
        fs::recursive_directory_iterator it( dir ), last;

        for( ; it != last; ++it )
        {
            if( it->status().type() == fs::directory_file )
            {
                continue;
            }

            headers.insert( it->path().generic_string() );
        }
    }
}